

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ExportModuleField::~ExportModuleField(ExportModuleField *this)

{
  ExportModuleField *this_local;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ExportModuleField_01e537d8;
  Export::~Export(&this->export_);
  ModuleFieldMixin<(wabt::ModuleFieldType)3>::~ModuleFieldMixin
            (&this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>);
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}